

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfmt.hpp
# Opt level: O0

string * __thiscall
cpptrace::microfmt::detail::to_string<1,1>
          (string *__return_storage_ptr__,detail *this,uint64_t value,char *digits)

{
  value_type vVar1;
  uint64_t uVar2;
  reference pvVar3;
  size_type local_50;
  size_t i;
  unsigned_long n_digits;
  allocator<char> local_21;
  uint64_t local_20;
  char *digits_local;
  uint64_t value_local;
  string *number;
  
  local_20 = value;
  digits_local = (char *)this;
  value_local = (uint64_t)__return_storage_ptr__;
  if (this == (detail *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"0",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    uVar2 = clz((uint64_t)this);
    local_50 = to<unsigned_long,unsigned_long>(0x40 - uVar2);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    for (; local_50 = local_50 - 1, digits_local != (char *)0x0;
        digits_local = (char *)((ulong)digits_local >> 1)) {
      vVar1 = *(value_type *)(local_20 + ((uint)digits_local & 1));
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](__return_storage_ptr__,local_50);
      *pvVar3 = vVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(std::uint64_t value, const char* digits = "0123456789abcdef") {
            if(value == 0) {
                return "0";
            } else {
                // digits = floor(1 + log_base(x))
                // log_base(x) = log_2(x) / log_2(base)
                // log_2(x) == 63 - clz(x)
                // 1 + (63 - clz(value)) / (63 - clz(1 << shift))
                // 63 - clz(1 << shift) is the same as shift
                auto n_digits = to<std::size_t>(1 + (63 - clz(value)) / shift);
                std::string number;
                number.resize(n_digits);
                std::size_t i = n_digits - 1;
                while(value > 0) {
                    number[i--] = digits[value & mask];
                    value >>= shift;
                }
                return number;
            }
        }